

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O0

bool __thiscall lunasvg::SVGPoint::parse(SVGPoint *this,string_view input)

{
  bool bVar1;
  Point local_30;
  Point value;
  SVGPoint *this_local;
  string_view input_local;
  
  input_local._M_len = (size_t)input._M_str;
  this_local = (SVGPoint *)input._M_len;
  value = (Point)this;
  Point::Point(&local_30);
  stripLeadingAndTrailingSpaces((string_view *)&this_local);
  bVar1 = parseNumber<float>((string_view *)&this_local,&local_30.x);
  if ((((bVar1) && (bVar1 = skipOptionalSpaces((string_view *)&this_local), bVar1)) &&
      (bVar1 = parseNumber<float>((string_view *)&this_local,&local_30.y), bVar1)) &&
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local), bVar1)) {
    *(Point *)&(this->super_SVGProperty).field_0xc = local_30;
    input_local._M_str._7_1_ = true;
  }
  else {
    input_local._M_str._7_1_ = false;
  }
  return input_local._M_str._7_1_;
}

Assistant:

bool SVGPoint::parse(std::string_view input)
{
    Point value;
    stripLeadingAndTrailingSpaces(input);
    if(!parseNumber(input, value.x)
        || !skipOptionalSpaces(input)
        || !parseNumber(input, value.y)
        || !input.empty()) {
        return false;
    }

    m_value = value;
    return true;
}